

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::getp_to_byte_array(vm_val_t *retval,vm_val_t *self_val,char *str,uint *oargc)

{
  int iVar1;
  vm_obj_id_t obj;
  int *in_RCX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  vm_val_t *cmap;
  int argc;
  vm_val_t *in_stack_00000180;
  char *in_stack_00000188;
  vm_val_t *in_stack_00000190;
  CVmNativeCodeDesc *in_stack_ffffffffffffff98;
  uint *in_stack_ffffffffffffffa0;
  vm_val_t *in_stack_ffffffffffffffa8;
  int local_4c;
  
  if (in_RCX == (int *)0x0) {
    local_4c = 0;
  }
  else {
    local_4c = *in_RCX;
  }
  if ((getp_to_byte_array(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_to_byte_array(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_to_byte_array::desc,0,1);
    __cxa_guard_release(&getp_to_byte_array(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                         desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (iVar1 == 0) {
    if (0 < local_4c) {
      CVmStack::get(0);
    }
    CVmStack::push(in_RSI);
    obj = CVmObjByteArray::create_from_string(in_stack_00000190,in_stack_00000188,in_stack_00000180)
    ;
    vm_val_t::set_obj(in_RDI,obj);
    CVmStack::discard(local_4c + 1);
  }
  return 1;
}

Assistant:

int CVmObjString::getp_to_byte_array(VMG_ vm_val_t *retval,
                                     const vm_val_t *self_val,
                                     const char *str, uint *oargc)
{
    /* check arguments */
    int argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* note the mapper argument */
    const vm_val_t *cmap = (argc >= 1 ? G_stk->get(0) : 0);

    /* save the string for gc protection */
    G_stk->push(self_val);

    /* create the byte array */
    retval->set_obj(CVmObjByteArray::create_from_string(
        vmg_ self_val, str, cmap));

    /* discard arguments and gc protection */
    G_stk->discard(argc + 1);

    /* handled */
    return TRUE;
}